

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testAll(void)

{
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> timer;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"LKH",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"milliseconds",&local_b1);
  helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)local_58,&local_78,
             &local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  testDoOpt();
  helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
            ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)local_58);
  return;
}

Assistant:

void testAll()
{
    // testDataReader();
    // testInitTSP();
    // testDoOpt();
#ifdef NO_TEST
    EdgeTest e_test;
    e_test.test();
    TourTest tour_test;
    tour_test.test();
    TSPTest tsp_test;
    tsp_test.test();
#endif
    helptool::Timer<std::chrono::milliseconds> timer("LKH", "milliseconds");
    testDoOpt();
}